

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_xlat.cpp
# Opt level: O0

int P_TranslateSectorSpecial(int special)

{
  uint uVar1;
  FSectorMask *pFVar2;
  FSectorTrans *pFVar3;
  uint local_18;
  uint local_14;
  int newmask;
  int i;
  int mask;
  int special_local;
  
  newmask = 0;
  local_14 = TArray<FSectorMask,_FSectorMask>::Size(&SectorMasks);
  i = special;
  while (local_14 = local_14 - 1, -1 < (int)local_14) {
    pFVar2 = TArray<FSectorMask,_FSectorMask>::operator[](&SectorMasks,(long)(int)local_14);
    local_18 = i & pFVar2->mask;
    if (local_18 != 0) {
      i = (local_18 ^ 0xffffffff) & i;
      pFVar2 = TArray<FSectorMask,_FSectorMask>::operator[](&SectorMasks,(long)(int)local_14);
      if (pFVar2->op == 1) {
        pFVar2 = TArray<FSectorMask,_FSectorMask>::operator[](&SectorMasks,(long)(int)local_14);
        local_18 = local_18 << ((byte)pFVar2->shift & 0x1f);
      }
      else {
        pFVar2 = TArray<FSectorMask,_FSectorMask>::operator[](&SectorMasks,(long)(int)local_14);
        if (pFVar2->op == -1) {
          pFVar2 = TArray<FSectorMask,_FSectorMask>::operator[](&SectorMasks,(long)(int)local_14);
          local_18 = (int)local_18 >> ((byte)pFVar2->shift & 0x1f);
        }
        else {
          pFVar2 = TArray<FSectorMask,_FSectorMask>::operator[](&SectorMasks,(long)(int)local_14);
          if ((pFVar2->op == 0) &&
             (pFVar2 = TArray<FSectorMask,_FSectorMask>::operator[]
                                 (&SectorMasks,(long)(int)local_14), pFVar2->shift == 1)) {
            local_18 = 0;
          }
        }
      }
      newmask = local_18 | newmask;
    }
  }
  uVar1 = TArray<FSectorTrans,_FSectorTrans>::Size
                    (&SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>);
  if ((uint)i < uVar1) {
    pFVar3 = TArray<FSectorTrans,_FSectorTrans>::operator[]
                       (&SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>,(long)i);
    if (((pFVar3->bitmask_allowed & 1U) == 0) && (newmask != 0)) {
      i = 0;
    }
    else {
      pFVar3 = TArray<FSectorTrans,_FSectorTrans>::operator[]
                         (&SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>,(long)i);
      i = pFVar3->newtype;
    }
  }
  return i | newmask;
}

Assistant:

int P_TranslateSectorSpecial (int special)
{
	int mask = 0;

	for(int i = SectorMasks.Size()-1; i>=0; i--)
	{
		int newmask = special & SectorMasks[i].mask;
		if (newmask)
		{
			special &= ~newmask;
			if (SectorMasks[i].op == 1)
				newmask <<= SectorMasks[i].shift;
			else if (SectorMasks[i].op == -1)
				newmask >>= SectorMasks[i].shift;
			else if (SectorMasks[i].op == 0 && SectorMasks[i].shift == 1)
				newmask = 0;
			mask |= newmask;
		}
	}
	
	if ((unsigned)special < SectorTranslations.Size())
	{
		if (!SectorTranslations[special].bitmask_allowed && mask)
			special = 0;
		else
			special = SectorTranslations[special].newtype;
	}
	return special | mask;
}